

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O3

void __thiscall
iqnet::Reactor<boost::mutex>::register_handler
          (Reactor<boost::mutex> *this,Event_handler *eh,Event_mask mask)

{
  _Rb_tree_header *p_Var1;
  ushort *puVar2;
  size_t *psVar3;
  int iVar4;
  _Base_ptr p_Var5;
  _List_node_base *p_Var6;
  mapped_type *ppEVar7;
  _Base_ptr p_Var8;
  Handler fd;
  scoped_lock lk;
  int local_3c;
  unique_lock<boost::mutex> local_38;
  
  local_38.m = &this->lock;
  local_38.is_locked = false;
  boost::unique_lock<boost::mutex>::lock(&local_38);
  iVar4 = (*eh->_vptr_Event_handler[2])(eh);
  if ((char)iVar4 != '\0') {
    this->num_stoppers = this->num_stoppers + 1;
  }
  iVar4 = (*eh->_vptr_Event_handler[9])(eh);
  p_Var5 = (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_3c = iVar4;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->handlers)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      if (iVar4 <= (int)p_Var5[1]._M_color) {
        p_Var8 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar4];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var8 != p_Var1) && ((int)p_Var8[1]._M_color <= iVar4)) {
      p_Var6 = (this->handlers_states).
               super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      iVar4 = (*eh->_vptr_Event_handler[9])(eh);
      for (; (p_Var6 != (_List_node_base *)&this->handlers_states &&
             (*(int *)&p_Var6[1]._M_next != iVar4)); p_Var6 = p_Var6->_M_next) {
      }
      puVar2 = (ushort *)((long)&p_Var6[1]._M_next + 4);
      *puVar2 = *puVar2 | (ushort)mask;
      goto LAB_0014d2ff;
    }
  }
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = (_List_node_base *)(CONCAT44(mask,iVar4) & 0xffffffffffff);
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar3 = &(this->handlers_states).
            super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
            ._M_impl._M_node._M_size;
  *psVar3 = *psVar3 + 1;
  ppEVar7 = std::
            map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
            ::operator[](&this->handlers,&local_3c);
  *ppEVar7 = eh;
LAB_0014d2ff:
  if (local_38.is_locked == true) {
    boost::mutex::unlock(local_38.m);
  }
  return;
}

Assistant:

void Reactor<Lock>::register_handler( Event_handler* eh, Event_mask mask )
{
  scoped_lock lk(lock);

  if (eh->is_stopper())
    num_stoppers++;

  Socket::Handler fd = eh->get_handler();

  if( handlers.find(fd) == handlers.end() )
  {
    handlers_states.push_back( HandlerState(fd, mask) );
    handlers[fd] = eh;
  }
  else
  {
    typename Reactor<Lock>::hs_iterator i = find_handler_state(eh);
    i->mask |= mask;
  }
}